

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int32 keycmp_nocase(hash_entry_t *entry,char *key)

{
  char cVar1;
  char cVar2;
  char *local_30;
  char *str;
  int32 i;
  char c2;
  char c1;
  char *key_local;
  hash_entry_t *entry_local;
  
  str._0_4_ = 0;
  local_30 = entry->key;
  _i = key;
  while( true ) {
    if (entry->len <= (ulong)(long)(int)str) {
      return 0;
    }
    cVar1 = *local_30;
    if (('`' < cVar1) && (cVar1 < '{')) {
      cVar1 = cVar1 + -0x20;
    }
    cVar2 = *_i;
    if (('`' < cVar2) && (cVar2 < '{')) {
      cVar2 = cVar2 + -0x20;
    }
    if (cVar1 != cVar2) break;
    str._0_4_ = (int)str + 1;
    local_30 = local_30 + 1;
    _i = _i + 1;
  }
  return (int)cVar1 - (int)cVar2;
}

Assistant:

static int32
keycmp_nocase(hash_entry_t * entry, const char *key)
{
    char c1, c2;
    int32 i;
    const char *str;

    str = entry->key;
    for (i = 0; i < entry->len; i++) {
        c1 = *(str++);
        c1 = UPPER_CASE(c1);
        c2 = *(key++);
        c2 = UPPER_CASE(c2);
        if (c1 != c2)
            return (c1 - c2);
    }

    return 0;
}